

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O2

void SoPlex_getLowerReal(void *soplex,double *lb,int dim)

{
  ulong uVar1;
  ulong uVar2;
  Vector lbvec;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  ::soplex::VectorBase<double>::VectorBase((VectorBase<double> *)&local_38,dim);
  ::soplex::SoPlexBase<double>::getLowerReal
            ((SoPlexBase<double> *)soplex,(VectorBase<double> *)&local_38);
  uVar1 = 0;
  uVar2 = (ulong)(uint)dim;
  if (dim < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    lb[uVar1] = local_38._M_impl.super__Vector_impl_data._M_start[uVar1];
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void SoPlex_getLowerReal(void* soplex, double* lb, int dim)
{
   SoPlex* so = (SoPlex*)(soplex);
   Vector lbvec(dim);

   so->getLowerReal(lbvec);

   for(int i = 0; i < dim; ++i)
      lb[i] = lbvec[i];
}